

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

void print_statdiff(char *prefix,char *fmt,long oldv,long newv)

{
  attr_t local_30;
  int local_2c;
  attr_t attr;
  int col;
  long newv_local;
  long oldv_local;
  char *fmt_local;
  char *prefix_local;
  
  _attr = newv;
  newv_local = oldv;
  oldv_local = (long)fmt;
  fmt_local = prefix;
  if ((prefix != (char *)0x0) && (*prefix != '\0')) {
    waddnstr(statuswin,prefix,0xffffffff);
  }
  status_change_color_on(&local_2c,&local_30,newv_local,0,_attr,0);
  wprintw(statuswin,oldv_local,_attr);
  status_change_color_off(local_2c,local_30);
  return;
}

Assistant:

static void print_statdiff(const char *prefix, const char *fmt,
			   long oldv, long newv)
{
    int col;
    attr_t attr;

    if (prefix && prefix[0])
	waddstr(statuswin, prefix);
    status_change_color_on(&col, &attr, oldv, 0, newv, 0);
    wprintw(statuswin, fmt, newv);
    status_change_color_off(col, attr);
}